

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BgzfStream_p.cpp
# Opt level: O0

bool BamTools::Internal::BgzfStream::CheckBlockHeader(char *header)

{
  unsigned_short uVar1;
  char *in_RDI;
  bool local_9;
  
  local_9 = false;
  if ((((*in_RDI == '\x1f') && (local_9 = false, in_RDI[1] == -0x75)) &&
      (local_9 = false, in_RDI[2] == '\b')) && (local_9 = false, (in_RDI[3] & 4U) != 0)) {
    uVar1 = UnpackUnsignedShort((char *)0x2c7e41);
    local_9 = false;
    if (((uVar1 == 6) && (local_9 = false, in_RDI[0xc] == 'B')) &&
       (local_9 = false, in_RDI[0xd] == 'C')) {
      uVar1 = UnpackUnsignedShort((char *)0x2c7e85);
      local_9 = uVar1 == 2;
    }
  }
  return local_9;
}

Assistant:

bool BgzfStream::CheckBlockHeader(char* header)
{
    return (header[0] == Constants::GZIP_ID1 && header[1] == Constants::GZIP_ID2 &&
            header[2] == Z_DEFLATED && (header[3] & Constants::FLG_FEXTRA) != 0 &&
            BamTools::UnpackUnsignedShort(&header[10]) == Constants::BGZF_XLEN &&
            header[12] == Constants::BGZF_ID1 && header[13] == Constants::BGZF_ID2 &&
            BamTools::UnpackUnsignedShort(&header[14]) == Constants::BGZF_LEN);
}